

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

void __thiscall glu::StructType::addMember(StructType *this,char *name,VarType *type)

{
  StructMember SStack_48;
  
  StructMember::StructMember(&SStack_48,name,type);
  std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>::
  emplace_back<glu::StructMember>(&this->m_members,&SStack_48);
  StructMember::~StructMember(&SStack_48);
  return;
}

Assistant:

void StructType::addMember (const char* name, const VarType& type)
{
	m_members.push_back(StructMember(name, type));
}